

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

ostream * pstd::operator<<(ostream *os,optional<pbrt::Bounds2<int>_> *opt)

{
  bool bVar1;
  ostream *poVar2;
  Bounds2<int> *this;
  string sStack_38;
  
  bVar1 = opt->set;
  poVar2 = std::operator<<(os,"[ pstd::optional<");
  poVar2 = std::operator<<(poVar2,"N4pbrt7Bounds2IiEE");
  if (bVar1 == true) {
    poVar2 = std::operator<<(poVar2,"> set: true ");
    poVar2 = std::operator<<(poVar2,"value: ");
    this = optional<pbrt::Bounds2<int>_>::value(opt);
    pbrt::Bounds2<int>::ToString_abi_cxx11_(&sStack_38,this);
    poVar2 = std::operator<<(poVar2,(string *)&sStack_38);
    std::__cxx11::string::~string((string *)&sStack_38);
    poVar2 = std::operator<<(poVar2," ]");
    return poVar2;
  }
  poVar2 = std::operator<<(poVar2,"> set: false value: n/a ]");
  return poVar2;
}

Assistant:

inline std::ostream &operator<<(std::ostream &os, const optional<T> &opt) {
    if (opt.has_value())
        return os << "[ pstd::optional<" << typeid(T).name() << "> set: true "
                  << "value: " << opt.value() << " ]";
    else
        return os << "[ pstd::optional<" << typeid(T).name()
                  << "> set: false value: n/a ]";
}